

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_loop_restoration_dealloc(AV1LrSync *lr_sync)

{
  LRWorkerData *memblk;
  int worker_idx;
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (lr_sync != (AV1LrSync *)0x0) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (lr_sync->mutex_[lVar2] != (pthread_mutex_t *)0x0) {
        lVar3 = 0;
        for (lVar1 = 0; lVar1 < lr_sync->rows; lVar1 = lVar1 + 1) {
          pthread_mutex_destroy((pthread_mutex_t *)((long)lr_sync->mutex_[lVar2] + lVar3));
          lVar3 = lVar3 + 0x28;
        }
        aom_free(lr_sync->mutex_[lVar2]);
      }
      if (lr_sync->cond_[lVar2] != (pthread_cond_t *)0x0) {
        lVar3 = 0;
        for (lVar1 = 0; lVar1 < lr_sync->rows; lVar1 = lVar1 + 1) {
          pthread_cond_destroy((pthread_cond_t *)((long)lr_sync->cond_[lVar2] + lVar3));
          lVar3 = lVar3 + 0x30;
        }
        aom_free(lr_sync->cond_[lVar2]);
      }
    }
    if (lr_sync->job_mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)lr_sync->job_mutex);
      aom_free(lr_sync->job_mutex);
    }
    for (lVar2 = 6; lVar2 != 9; lVar2 = lVar2 + 1) {
      aom_free(lr_sync->mutex_[lVar2]);
    }
    aom_free(lr_sync->job_queue);
    if (lr_sync->lrworkerdata != (LRWorkerData *)0x0) {
      lVar2 = 8;
      for (lVar1 = 0; memblk = lr_sync->lrworkerdata, lVar1 < (long)lr_sync->num_workers + -1;
          lVar1 = lVar1 + 1) {
        aom_free(*(void **)((memblk->error_info).detail + lVar2 + -0x30));
        aom_free(*(void **)((memblk->error_info).detail + lVar2 + -0x28));
        lVar2 = lVar2 + 0x1c0;
      }
      aom_free(memblk);
    }
    lr_sync->jobs_enqueued = 0;
    lr_sync->jobs_dequeued = 0;
    *(undefined8 *)&lr_sync->lr_mt_exit = 0;
    lr_sync->lrworkerdata = (LRWorkerData *)0x0;
    lr_sync->job_queue = (AV1LrMTInfo *)0x0;
    lr_sync->num_planes = 0;
    lr_sync->num_workers = 0;
    lr_sync->job_mutex = (pthread_mutex_t *)0x0;
    lr_sync->cur_sb_col[2] = (int *)0x0;
    lr_sync->sync_range = 0;
    lr_sync->rows = 0;
    lr_sync->cur_sb_col[0] = (int *)0x0;
    lr_sync->cur_sb_col[1] = (int *)0x0;
    lr_sync->cond_[1] = (pthread_cond_t *)0x0;
    lr_sync->cond_[2] = (pthread_cond_t *)0x0;
    lr_sync->mutex_[2] = (pthread_mutex_t *)0x0;
    lr_sync->cond_[0] = (pthread_cond_t *)0x0;
    lr_sync->mutex_[0] = (pthread_mutex_t *)0x0;
    lr_sync->mutex_[1] = (pthread_mutex_t *)0x0;
  }
  return;
}

Assistant:

void av1_loop_restoration_dealloc(AV1LrSync *lr_sync) {
  if (lr_sync != NULL) {
    int j;
#if CONFIG_MULTITHREAD
    int i;
    for (j = 0; j < MAX_MB_PLANE; j++) {
      if (lr_sync->mutex_[j] != NULL) {
        for (i = 0; i < lr_sync->rows; ++i) {
          pthread_mutex_destroy(&lr_sync->mutex_[j][i]);
        }
        aom_free(lr_sync->mutex_[j]);
      }
      if (lr_sync->cond_[j] != NULL) {
        for (i = 0; i < lr_sync->rows; ++i) {
          pthread_cond_destroy(&lr_sync->cond_[j][i]);
        }
        aom_free(lr_sync->cond_[j]);
      }
    }
    if (lr_sync->job_mutex != NULL) {
      pthread_mutex_destroy(lr_sync->job_mutex);
      aom_free(lr_sync->job_mutex);
    }
#endif  // CONFIG_MULTITHREAD
    for (j = 0; j < MAX_MB_PLANE; j++) {
      aom_free(lr_sync->cur_sb_col[j]);
    }

    aom_free(lr_sync->job_queue);

    if (lr_sync->lrworkerdata) {
      for (int worker_idx = 0; worker_idx < lr_sync->num_workers - 1;
           worker_idx++) {
        LRWorkerData *const workerdata_data =
            lr_sync->lrworkerdata + worker_idx;

        aom_free(workerdata_data->rst_tmpbuf);
        aom_free(workerdata_data->rlbs);
      }
      aom_free(lr_sync->lrworkerdata);
    }

    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*lr_sync);
  }
}